

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O2

void round_shift_rect_array_32_avx2(__m256i *input,__m256i *output,int size,int bit,int val)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  if (size < 1) {
    auVar9._8_4_ = 0x16a1;
    auVar9._0_8_ = 0x16a1000016a1;
    auVar9._12_4_ = 0x16a1;
    auVar9._16_4_ = 0x16a1;
    auVar9._20_4_ = 0x16a1;
    auVar9._24_4_ = 0x16a1;
    auVar9._28_4_ = 0x16a1;
    auVar6._8_4_ = 0x800;
    auVar6._0_8_ = 0x80000000800;
    auVar6._12_4_ = 0x800;
    auVar6._16_4_ = 0x800;
    auVar6._20_4_ = 0x800;
    auVar6._24_4_ = 0x800;
    auVar6._28_4_ = 0x800;
    for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 0x20) {
      auVar8 = vpslld_avx2(*(undefined1 (*) [32])((long)*input + lVar4),ZEXT416((uint)-size));
      auVar8 = vpmulld_avx2(auVar8,auVar9);
      auVar8 = vpaddd_avx2(auVar8,auVar6);
      auVar8 = vpsrad_avx2(auVar8,0xc);
      *(undefined1 (*) [32])((long)*output + lVar4) = auVar8;
    }
  }
  else {
    bVar1 = (char)size - 1U & 0x1f;
    iVar2 = 1 << bVar1;
    auVar8._4_4_ = iVar2;
    auVar8._0_4_ = iVar2;
    auVar8._8_4_ = iVar2;
    auVar8._12_4_ = iVar2;
    auVar8._16_4_ = iVar2;
    auVar8._20_4_ = iVar2;
    auVar8._24_4_ = iVar2;
    auVar8._28_4_ = iVar2;
    auVar5._8_4_ = 0x16a1;
    auVar5._0_8_ = 0x16a1000016a1;
    auVar5._12_4_ = 0x16a1;
    auVar5._16_4_ = 0x16a1;
    auVar5._20_4_ = 0x16a1;
    auVar5._24_4_ = 0x16a1;
    auVar5._28_4_ = 0x16a1;
    auVar7._8_4_ = 0x800;
    auVar7._0_8_ = 0x80000000800;
    auVar7._12_4_ = 0x800;
    auVar7._16_4_ = 0x800;
    auVar7._20_4_ = 0x800;
    auVar7._24_4_ = 0x800;
    auVar7._28_4_ = 0x800;
    for (uVar3 = (ulong)(uint)(0 << bVar1); uVar3 != 0x200; uVar3 = uVar3 + 0x20) {
      auVar9 = vpaddd_avx2(auVar8,*(undefined1 (*) [32])((long)*input + uVar3));
      auVar9 = vpsrad_avx2(auVar9,ZEXT416((uint)size));
      auVar9 = vpmulld_avx2(auVar9,auVar5);
      auVar9 = vpaddd_avx2(auVar9,auVar7);
      auVar9 = vpsrad_avx2(auVar9,0xc);
      *(undefined1 (*) [32])((long)*output + uVar3) = auVar9;
    }
  }
  return;
}

Assistant:

static inline void round_shift_rect_array_32_avx2(__m256i *input,
                                                  __m256i *output,
                                                  const int size, const int bit,
                                                  const int val) {
  const __m256i sqrt2 = _mm256_set1_epi32(val);
  if (bit > 0) {
    int i;
    for (i = 0; i < size; i++) {
      const __m256i r0 = round_shift_32_avx2(input[i], bit);
      const __m256i r1 = _mm256_mullo_epi32(sqrt2, r0);
      output[i] = round_shift_32_avx2(r1, NewSqrt2Bits);
    }
  } else {
    int i;
    for (i = 0; i < size; i++) {
      const __m256i r0 = _mm256_slli_epi32(input[i], -bit);
      const __m256i r1 = _mm256_mullo_epi32(sqrt2, r0);
      output[i] = round_shift_32_avx2(r1, NewSqrt2Bits);
    }
  }
}